

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  basic_format_specs<char> *pbVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  char cVar8;
  ulong uVar9;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar10;
  _Alloc_hider _Var11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  size_type sVar17;
  long lVar18;
  uint uVar19;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  string groups;
  char digits [40];
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar20;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar8 != '\0') {
      puVar1 = &this->abs_value;
      uVar23 = (ulong)*puVar1;
      uVar9 = *(ulong *)((long)&this->abs_value + 8);
      auVar6 = (undefined1  [16])*puVar1;
      auVar25 = (undefined1  [16])*puVar1;
      uVar22 = 1;
      if ((uVar23 < 10) <= uVar9) {
        uVar22 = 4;
        auVar24 = auVar25;
        do {
          uVar20 = auVar24._8_8_;
          uVar14 = auVar24._0_8_;
          iVar12 = (int)uVar22;
          if (uVar20 == 0 && (ulong)(99 < uVar14) <= -uVar20) {
            uVar22 = (ulong)(iVar12 - 2);
            goto LAB_0049e578;
          }
          if (uVar20 == 0 && (ulong)(999 < uVar14) <= -uVar20) {
            uVar22 = (ulong)(iVar12 - 1);
            goto LAB_0049e578;
          }
          if (uVar20 < (uVar14 < 10000)) goto LAB_0049e578;
          auVar24 = __udivti3(uVar14,uVar20,10000,0);
          uVar22 = (ulong)(iVar12 + 4);
        } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar14));
        uVar22 = (ulong)(iVar12 + 1);
      }
LAB_0049e578:
      pcVar16 = local_298._M_dataplus._M_p + local_298._M_string_length;
      uVar5 = (uint)uVar22;
      _Var11._M_p = local_298._M_dataplus._M_p;
      uVar14 = uVar22;
      uVar13 = uVar5;
      if (local_298._M_string_length != 0) {
        sVar17 = local_298._M_string_length;
        uVar20 = uVar22;
        do {
          uVar13 = (uint)uVar20;
          cVar3 = *_Var11._M_p;
          uVar19 = uVar13 - (int)cVar3;
          uVar20 = (ulong)uVar19;
          if ((uVar19 == 0 || (int)uVar13 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
          goto LAB_0049e5c8;
          uVar14 = (ulong)((int)uVar14 + 1);
          _Var11._M_p = _Var11._M_p + 1;
          sVar17 = sVar17 - 1;
        } while (sVar17 != 0);
        _Var11._M_p = pcVar16;
        uVar14 = (ulong)(uVar5 + (int)local_298._M_string_length);
        uVar13 = uVar19;
      }
LAB_0049e5c8:
      iVar12 = (int)uVar14;
      if (_Var11._M_p == pcVar16) {
        iVar12 = iVar12 + (int)(uVar13 - 1) / (int)pcVar16[-1];
      }
      iVar15 = 1;
      if ((uVar23 < 10) <= uVar9) {
        iVar7 = 4;
        auVar24 = auVar25;
        do {
          iVar15 = iVar7;
          uVar20 = auVar24._8_8_;
          uVar14 = auVar24._0_8_;
          if (uVar20 == 0 && (ulong)(99 < uVar14) <= -uVar20) {
            iVar15 = iVar15 + -2;
            goto LAB_0049e66c;
          }
          if (uVar20 == 0 && (ulong)(999 < uVar14) <= -uVar20) {
            iVar15 = iVar15 + -1;
            goto LAB_0049e66c;
          }
          if (uVar20 < (uVar14 < 10000)) goto LAB_0049e66c;
          auVar24 = __udivti3(uVar14,uVar20,10000,0);
          iVar7 = iVar15 + 4;
        } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar14));
        iVar15 = iVar15 + 1;
      }
LAB_0049e66c:
      if ((int)uVar5 < iVar15) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format.h"
                    ,0x41b,"invalid digit count");
      }
      pcVar16 = local_278 + (int)uVar5;
      pcVar21 = pcVar16;
      if ((uVar23 < 100) <= uVar9) {
        do {
          lVar18 = auVar25._8_8_;
          uVar23 = auVar25._0_8_;
          pcVar16 = pcVar21 + -2;
          auVar25 = __udivti3(uVar23,lVar18,100,0);
          *(undefined2 *)(pcVar21 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar23 + auVar25._0_8_ * -100) * 2);
          pcVar21 = pcVar16;
          auVar6 = auVar25;
        } while (lVar18 != 0 || (ulong)-lVar18 < (ulong)(9999 < uVar23));
      }
      if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
        pcVar16[-1] = auVar6[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar16 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar6._0_8_ * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_006a6a70;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar13 = iVar12 + this->prefix_size;
      if (-1 < (int)uVar13) {
        uVar23 = (ulong)uVar13;
        if (500 < uVar13) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar23);
        }
        pcVar16 = local_248.super_buffer<char>.ptr_;
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar23 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar23;
        }
        pcVar21 = local_248.super_buffer<char>.ptr_ + (uVar23 - 1);
        if (1 < (int)uVar5) {
          lVar18 = uVar22 + 1;
          iVar12 = 0;
          _Var11._M_p = local_298._M_dataplus._M_p;
          do {
            pcVar2 = pcVar21 + -1;
            *pcVar21 = local_278[lVar18 + -2];
            cVar3 = *_Var11._M_p;
            if ('\0' < cVar3) {
              iVar12 = iVar12 + 1;
              if ((cVar3 != '\x7f') && (iVar12 % (int)cVar3 == 0)) {
                if (_Var11._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                  iVar12 = 0;
                  _Var11._M_p = _Var11._M_p + 1;
                }
                pcVar21[-1] = cVar8;
                pcVar2 = pcVar21 + -2;
              }
            }
            pcVar21 = pcVar2;
            lVar18 = lVar18 + -1;
          } while (2 < lVar18);
        }
        *pcVar21 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar21[-1] = 0x2d;
        }
        pbVar4 = this->specs;
        uVar9 = (ulong)pbVar4->width;
        if (-1 < (long)uVar9) {
          uVar22 = 0;
          if (uVar23 <= uVar9) {
            uVar22 = uVar9 - uVar23;
          }
          uVar9 = uVar22 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                      (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
          bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                             ((this->out).container,uVar9,&pbVar4->fill);
          bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                             (pcVar16,pcVar16 + uVar23,bVar10);
          bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                             (bVar10,uVar22 - uVar9,&pbVar4->fill);
          (this->out).container = bVar10.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_);
          }
          goto LAB_0049e889;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_0049e889:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }